

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

string * __thiscall
flatbuffers::ts::TsGenerator::GenSymbolExpression
          (string *__return_storage_ptr__,TsGenerator *this,EnumDef *enum_def,bool has_name_clash,
          string *import_name,string *name,string *param_5)

{
  pointer pcVar1;
  long *plVar2;
  undefined7 in_register_00000009;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_98;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000009,has_name_clash) == 0) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(name->_M_dataplus)._M_p);
  }
  else {
    pcVar1 = (import_name->_M_dataplus)._M_p;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar1,pcVar1 + import_name->_M_string_length);
    std::__cxx11::string::append((char *)local_78);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_78,(ulong)(name->_M_dataplus)._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_88 = *plVar3;
      lStack_80 = plVar2[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar3;
      local_98 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  if (enum_def->is_union == true) {
    std::operator+(&local_58,"unionTo",name);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (local_78,&this->namer_,&local_58,(ulong)(this->namer_).super_Namer.config_.functions)
    ;
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x37606e);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_88 = *plVar3;
      lStack_80 = plVar2[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar3;
      local_98 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_58,"unionListTo",name);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (local_78,&this->namer_,&local_58,(ulong)(this->namer_).super_Namer.config_.functions)
    ;
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x37606e);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_88 = *plVar3;
      lStack_80 = plVar2[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar3;
      local_98 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenSymbolExpression(const EnumDef &enum_def,
                                  const bool has_name_clash,
                                  const std::string &import_name,
                                  const std::string &name,
                                  const std::string &) {
    std::string symbols_expression;
    if (has_name_clash) {
      symbols_expression += import_name + " as " + name;
    } else {
      symbols_expression += name;
    }

    if (enum_def.is_union) {
      symbols_expression += (", " + namer_.Function("unionTo" + name));
      symbols_expression += (", " + namer_.Function("unionListTo" + name));
    }

    return symbols_expression;
  }